

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opmath.cpp
# Opt level: O0

int32_t op_exponent(int32_t base,uint32_t power)

{
  undefined4 local_14;
  undefined4 local_10;
  int32_t result;
  uint32_t power_local;
  int32_t base_local;
  
  local_14 = 1;
  local_10 = power;
  result = base;
  while( true ) {
    if ((local_10 & 1) != 0) {
      local_14 = result * local_14;
    }
    local_10 = local_10 >> 1;
    if (local_10 == 0) break;
    result = result * result;
  }
  return local_14;
}

Assistant:

int32_t op_exponent(int32_t base, uint32_t power)
{
	int32_t result = 1;

	for (;;) {
		if (power % 2)
			result *= base;
		power /= 2;
		if (!power)
			break;
		base *= base;
	}

	return result;
}